

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu_x86.cpp
# Opt level: O1

int __thiscall ncnn::PReLU_x86::forward_inplace(PReLU_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  int iVar4;
  float *pfVar5;
  void *pvVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  float *ptr;
  int iVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  undefined1 (*pauVar15) [16];
  undefined1 (*pauVar16) [16];
  undefined1 auVar17 [16];
  float fVar18;
  float fVar20;
  float fVar21;
  undefined1 auVar19 [16];
  float fVar22;
  undefined1 auVar23 [16];
  
  iVar11 = bottom_top_blob->elempack;
  iVar8 = bottom_top_blob->dims;
  iVar4 = bottom_top_blob->w;
  uVar7 = bottom_top_blob->h;
  uVar10 = bottom_top_blob->c;
  if (iVar8 == 3) {
    if (0 < (int)uVar10) {
      uVar7 = iVar4 * iVar11 * uVar7;
      uVar14 = 0;
      do {
        iVar8 = (this->super_PReLU).num_slope;
        uVar13 = uVar14 & 0xffffffff;
        if (iVar8 < 2) {
          uVar13 = 0;
        }
        fVar3 = *(float *)((long)(this->super_PReLU).slope_data.data + uVar13 * 4);
        fVar18 = fVar3;
        fVar20 = fVar3;
        fVar21 = fVar3;
        fVar22 = fVar3;
        if (1 < iVar8 && iVar11 == 4) {
          pfVar5 = (float *)((long)(this->super_PReLU).slope_data.data + uVar14 * 0x10);
          fVar18 = *pfVar5;
          fVar20 = pfVar5[1];
          fVar21 = pfVar5[2];
          fVar22 = pfVar5[3];
        }
        pauVar16 = (undefined1 (*) [16])
                   (bottom_top_blob->cstep * uVar14 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar9 = 0;
        if (3 < (int)uVar7) {
          iVar8 = 3;
          do {
            auVar19 = maxps(*pauVar16,ZEXT816(0));
            auVar17 = minps(*pauVar16,ZEXT816(0));
            auVar23._0_4_ = auVar17._0_4_ * fVar18 + auVar19._0_4_;
            auVar23._4_4_ = auVar17._4_4_ * fVar20 + auVar19._4_4_;
            auVar23._8_4_ = auVar17._8_4_ * fVar21 + auVar19._8_4_;
            auVar23._12_4_ = auVar17._12_4_ * fVar22 + auVar19._12_4_;
            *pauVar16 = auVar23;
            pauVar16 = pauVar16 + 1;
            iVar8 = iVar8 + 4;
            uVar9 = uVar7 & 0xfffffffc;
          } while (iVar8 < (int)uVar7);
        }
        if (uVar7 - uVar9 != 0 && (int)uVar9 <= (int)uVar7) {
          lVar12 = 0;
          do {
            if (*(float *)(*pauVar16 + lVar12 * 4) < 0.0) {
              *(float *)(*pauVar16 + lVar12 * 4) = *(float *)(*pauVar16 + lVar12 * 4) * fVar3;
            }
            lVar12 = lVar12 + 1;
          } while (uVar7 - uVar9 != (int)lVar12);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar10);
    }
  }
  else if (iVar8 == 2) {
    if (0 < (int)uVar7) {
      uVar10 = iVar11 * iVar4;
      uVar14 = 0;
      do {
        iVar8 = (this->super_PReLU).num_slope;
        uVar13 = uVar14 & 0xffffffff;
        if (iVar8 < 2) {
          uVar13 = 0;
        }
        fVar3 = *(float *)((long)(this->super_PReLU).slope_data.data + uVar13 * 4);
        fVar18 = fVar3;
        fVar20 = fVar3;
        fVar21 = fVar3;
        fVar22 = fVar3;
        if (1 < iVar8 && iVar11 == 4) {
          pfVar5 = (float *)((long)(this->super_PReLU).slope_data.data + uVar14 * 0x10);
          fVar18 = *pfVar5;
          fVar20 = pfVar5[1];
          fVar21 = pfVar5[2];
          fVar22 = pfVar5[3];
        }
        pauVar16 = (undefined1 (*) [16])
                   ((long)bottom_top_blob->w * uVar14 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar9 = 0;
        if (3 < (int)uVar10) {
          iVar8 = 3;
          do {
            auVar23 = maxps(*pauVar16,ZEXT816(0));
            auVar17 = minps(*pauVar16,ZEXT816(0));
            auVar19._0_4_ = auVar17._0_4_ * fVar18 + auVar23._0_4_;
            auVar19._4_4_ = auVar17._4_4_ * fVar20 + auVar23._4_4_;
            auVar19._8_4_ = auVar17._8_4_ * fVar21 + auVar23._8_4_;
            auVar19._12_4_ = auVar17._12_4_ * fVar22 + auVar23._12_4_;
            *pauVar16 = auVar19;
            pauVar16 = pauVar16 + 1;
            iVar8 = iVar8 + 4;
            uVar9 = uVar10 & 0xfffffffc;
          } while (iVar8 < (int)uVar10);
        }
        if (uVar10 - uVar9 != 0 && (int)uVar9 <= (int)uVar10) {
          lVar12 = 0;
          do {
            if (*(float *)(*pauVar16 + lVar12 * 4) < 0.0) {
              *(float *)(*pauVar16 + lVar12 * 4) = *(float *)(*pauVar16 + lVar12 * 4) * fVar3;
            }
            lVar12 = lVar12 + 1;
          } while (uVar10 - uVar9 != (int)lVar12);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar7);
    }
  }
  else if (iVar8 == 1) {
    iVar11 = iVar11 * iVar4;
    pauVar16 = (undefined1 (*) [16])bottom_top_blob->data;
    pfVar5 = (float *)(this->super_PReLU).slope_data.data;
    if ((this->super_PReLU).num_slope < 2) {
      fVar3 = *pfVar5;
      iVar8 = iVar11 + 3;
      if (-1 < iVar11) {
        iVar8 = iVar11;
      }
      if (3 < iVar11) {
        uVar14 = (ulong)(uint)(iVar8 >> 2);
        pauVar15 = pauVar16;
        do {
          auVar19 = maxps(*pauVar15,ZEXT816(0));
          auVar17 = minps(*pauVar15,ZEXT816(0));
          *(float *)*pauVar15 = auVar17._0_4_ * fVar3 + auVar19._0_4_;
          *(float *)(*pauVar15 + 4) = auVar17._4_4_ * fVar3 + auVar19._4_4_;
          *(float *)(*pauVar15 + 8) = auVar17._8_4_ * fVar3 + auVar19._8_4_;
          *(float *)(*pauVar15 + 0xc) = auVar17._12_4_ * fVar3 + auVar19._12_4_;
          pauVar15 = pauVar15 + 1;
          uVar14 = uVar14 - 1;
        } while (uVar14 != 0);
      }
      iVar8 = (iVar8 >> 2) * 4;
      if (iVar8 < iVar11) {
        lVar12 = (long)iVar8;
        do {
          if (*(float *)(*pauVar16 + lVar12 * 4) < 0.0) {
            *(float *)(*pauVar16 + lVar12 * 4) = *(float *)(*pauVar16 + lVar12 * 4) * fVar3;
          }
          lVar12 = lVar12 + 1;
        } while (iVar11 != lVar12);
      }
    }
    else {
      iVar8 = iVar11 + 3;
      if (-1 < iVar11) {
        iVar8 = iVar11;
      }
      if (3 < iVar11) {
        uVar14 = (ulong)(uint)(iVar8 >> 2);
        lVar12 = 0;
        do {
          pfVar1 = (float *)((long)pfVar5 + lVar12);
          fVar3 = pfVar1[1];
          fVar18 = pfVar1[2];
          fVar20 = pfVar1[3];
          auVar19 = maxps(*(undefined1 (*) [16])(*pauVar16 + lVar12),ZEXT816(0));
          auVar17 = minps(*(undefined1 (*) [16])(*pauVar16 + lVar12),ZEXT816(0));
          pfVar2 = (float *)(*pauVar16 + lVar12);
          *pfVar2 = auVar17._0_4_ * *pfVar1 + auVar19._0_4_;
          pfVar2[1] = auVar17._4_4_ * fVar3 + auVar19._4_4_;
          pfVar2[2] = auVar17._8_4_ * fVar18 + auVar19._8_4_;
          pfVar2[3] = auVar17._12_4_ * fVar20 + auVar19._12_4_;
          lVar12 = lVar12 + 0x10;
          uVar14 = uVar14 - 1;
        } while (uVar14 != 0);
      }
      iVar8 = (iVar8 >> 2) * 4;
      if (iVar8 < iVar11) {
        pvVar6 = (this->super_PReLU).slope_data.data;
        lVar12 = (long)iVar8;
        do {
          if (*(float *)(*pauVar16 + lVar12 * 4) < 0.0) {
            *(float *)(*pauVar16 + lVar12 * 4) =
                 *(float *)(*pauVar16 + lVar12 * 4) * *(float *)((long)pvVar6 + lVar12 * 4);
          }
          lVar12 = lVar12 + 1;
        } while (iVar11 != lVar12);
      }
    }
  }
  return 0;
}

Assistant:

int PReLU_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        const int size = w * elempack;

        if (num_slope > 1)
        {
            float* ptr = bottom_top_blob;
            const float* slope = slope_data;

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_loadu_ps(slope + i);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_loadu_ps(slope + i);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_loadu_ps(slope + i);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope_data[i];
            }
        }
        else
        {
            float* ptr = bottom_top_blob;
            const float slope = slope_data[0];

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_set1_ps(slope);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_set1_ps(slope);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_set1_ps(slope);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            int j = 0;

            float slope = num_slope > 1 ? slope_data[i] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_loadu_ps((const float*)slope_data + i * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _mm_storeu_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; j < size; j++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    if (dims == 3)
    {
        const int size = w * h * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            int i = 0;

            float slope = num_slope > 1 ? slope_data[q] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_loadu_ps((const float*)slope_data + q * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_load_ps(ptr);
                _mm_store_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    return 0;
}